

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:359:25)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:359:25)>
            *this)

{
  char (*in_RCX) [21];
  String SStack_1b8;
  Exception local_1a0;
  
  if ((this->maybeFunc).ptr.isSet != true) {
    return;
  }
  (this->maybeFunc).ptr.isSet = false;
  Debug::makeDescription<char_const(&)[21]>
            (&SStack_1b8,(Debug *)0x3e496b,"thrown during unwind",in_RCX);
  Exception::Exception
            (&local_1a0,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
             ,0x168,&SStack_1b8);
  throwFatalException(&local_1a0,0);
}

Assistant:

inline NullableValue& operator=(decltype(nullptr)) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    return *this;
  }